

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activity_tracking.hpp
# Opt level: O0

unique_ptr<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t>_>
 __thiscall
so_5::stats::activity_tracking_stuff::
create_appropriate_disp<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t,so_5::disp::prio_one_thread::strictly_ordered::impl::dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>>,so_5::disp::prio_one_thread::strictly_ordered::impl::dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>>,so_5::environment_t,so_5::disp::prio_one_thread::strictly_ordered::disp_params_t,so_5::disp::prio_one_thread::strictly_ordered::disp_params_t&>
          (activity_tracking_stuff *this,environment_t *env,disp_params_t *disp_params,
          disp_params_t *args)

{
  dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>_>
  *this_00;
  dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>_>
  *this_01;
  disp_params_t local_98;
  undefined1 local_69;
  disp_params_t local_68;
  work_thread_activity_tracking_t local_30;
  undefined1 local_29;
  work_thread_activity_tracking_t tracking;
  disp_params_t *args_local;
  disp_params_t *disp_params_local;
  environment_t *env_local;
  unique_ptr<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t>_>
  *disp;
  
  local_29 = 0;
  _tracking = args;
  args_local = disp_params;
  disp_params_local = (disp_params_t *)env;
  env_local = (environment_t *)this;
  std::
  unique_ptr<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t,std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t>>
  ::
  unique_ptr<std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t>,void>
            ((unique_ptr<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t,std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t>>
              *)this);
  local_30 = so_5::disp::reuse::
             work_thread_activity_tracking_flag_mixin_t<so_5::disp::prio_one_thread::strictly_ordered::disp_params_t>
             ::work_thread_activity_tracking
                       (&args_local->
                         super_work_thread_activity_tracking_flag_mixin_t<so_5::disp::prio_one_thread::strictly_ordered::disp_params_t>
                       );
  if (local_30 == unspecified) {
    local_30 = environment_t::work_thread_activity_tracking((environment_t *)disp_params_local);
  }
  if (local_30 == on) {
    this_00 = (dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>_>
               *)operator_new(0x260);
    local_69 = 1;
    so_5::disp::prio_one_thread::strictly_ordered::disp_params_t::disp_params_t(&local_68,_tracking)
    ;
    so_5::disp::prio_one_thread::strictly_ordered::impl::
    dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>_>
    ::dispatcher_template_t(this_00,&local_68);
    local_69 = 0;
    std::
    unique_ptr<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t>_>
    ::reset((unique_ptr<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t>_>
             *)this,(pointer)this_00);
    so_5::disp::prio_one_thread::strictly_ordered::disp_params_t::~disp_params_t(&local_68);
  }
  else {
    this_01 = (dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>_>
               *)operator_new(0x210);
    so_5::disp::prio_one_thread::strictly_ordered::disp_params_t::disp_params_t(&local_98,_tracking)
    ;
    so_5::disp::prio_one_thread::strictly_ordered::impl::
    dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>_>
    ::dispatcher_template_t(this_01,&local_98);
    std::
    unique_ptr<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t>_>
    ::reset((unique_ptr<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t>_>
             *)this,(pointer)this_01);
    so_5::disp::prio_one_thread::strictly_ordered::disp_params_t::~disp_params_t(&local_98);
  }
  return (__uniq_ptr_data<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t>,_true,_true>
          )(__uniq_ptr_data<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::actual_disp_iface_t>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr< COMMON_DISP_IFACE_TYPE >
create_appropriate_disp(
	ENV & env,
	const DISP_PARAMS & disp_params,
	ARGS && ...args )
	{
		std::unique_ptr< COMMON_DISP_IFACE_TYPE > disp;

		auto tracking = disp_params.work_thread_activity_tracking();
		if( work_thread_activity_tracking_t::unspecified == tracking )
			tracking = env.work_thread_activity_tracking();

		if( work_thread_activity_tracking_t::on == tracking )
			disp.reset(
				new DISP_WITH_TRACKING{ std::forward<ARGS>(args)... } );
		else
			disp.reset(
				new DISP_NO_TRACKING{ std::forward<ARGS>(args)... } );

		return disp;
	}